

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::XmlUnitTestResultPrinter::PrintXmlTestCase
               (ostream *stream,TestCase *test_case)

{
  bool bVar1;
  int iVar2;
  string *element_name;
  char *pcVar3;
  TestInfo *this;
  ostream *poVar4;
  TestCase *in_RSI;
  string *in_RDI;
  int i;
  TestInfo *in_stack_00000200;
  char *in_stack_00000208;
  ostream *in_stack_00000210;
  string kTestsuite;
  undefined8 in_stack_fffffffffffffcc8;
  TestInfo *in_stack_fffffffffffffcd0;
  undefined7 in_stack_fffffffffffffce8;
  undefined1 in_stack_fffffffffffffcef;
  TestResult *result;
  string *value;
  string *psVar5;
  allocator *stream_00;
  int local_244;
  string local_240 [32];
  string local_220 [39];
  allocator local_1f9;
  string local_1f8 [39];
  allocator local_1d1;
  string local_1d0 [39];
  allocator local_1a9;
  TimeInMillis in_stack_fffffffffffffe58;
  string local_180 [39];
  allocator local_159;
  string local_158 [36];
  int local_134;
  string local_130 [39];
  allocator local_109;
  string local_108 [36];
  int local_e4;
  string local_e0 [39];
  allocator local_b9;
  string local_b8 [39];
  undefined1 local_91 [40];
  undefined1 local_69 [56];
  allocator local_31;
  string local_30 [32];
  TestCase *local_10;
  string *local_8;
  
  stream_00 = &local_31;
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"testsuite",stream_00);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  element_name = (string *)std::operator<<((ostream *)local_8,"  <");
  std::operator<<((ostream *)element_name,local_30);
  psVar5 = (string *)local_69;
  value = local_8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_69 + 1),"name",(allocator *)psVar5);
  pcVar3 = TestCase::name((TestCase *)0x16f52c);
  result = (TestResult *)local_91;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_91 + 1),pcVar3,(allocator *)result);
  OutputXmlAttribute((ostream *)stream_00,element_name,psVar5,value);
  std::__cxx11::string::~string((string *)(local_91 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_91);
  std::__cxx11::string::~string((string *)(local_69 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"tests",&local_b9);
  local_e4 = TestCase::reportable_test_count((TestCase *)0x16f615);
  StreamableToString<int>((int *)CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8));
  OutputXmlAttribute((ostream *)stream_00,element_name,psVar5,value);
  std::__cxx11::string::~string(local_e0);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  if ((FLAGS_gtest_list_tests & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_108,"failures",&local_109);
    local_134 = TestCase::failed_test_count((TestCase *)0x16f6f1);
    StreamableToString<int>((int *)CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8));
    OutputXmlAttribute((ostream *)stream_00,element_name,psVar5,value);
    std::__cxx11::string::~string(local_130);
    std::__cxx11::string::~string(local_108);
    std::allocator<char>::~allocator((allocator<char> *)&local_109);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_158,"disabled",&local_159);
    TestCase::reportable_disabled_test_count((TestCase *)0x16f7bd);
    StreamableToString<int>((int *)CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8));
    OutputXmlAttribute((ostream *)stream_00,element_name,psVar5,value);
    std::__cxx11::string::~string(local_180);
    std::__cxx11::string::~string(local_158);
    std::allocator<char>::~allocator((allocator<char> *)&local_159);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&stack0xfffffffffffffe58,"errors",&local_1a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1d0,"0",&local_1d1);
    OutputXmlAttribute((ostream *)stream_00,element_name,psVar5,value);
    std::__cxx11::string::~string(local_1d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe58);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1f8,"time",&local_1f9);
    TestCase::elapsed_time(local_10);
    FormatTimeInMillisAsSeconds_abi_cxx11_(in_stack_fffffffffffffe58);
    OutputXmlAttribute((ostream *)stream_00,element_name,psVar5,value);
    std::__cxx11::string::~string(local_220);
    std::__cxx11::string::~string(local_1f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
    psVar5 = local_8;
    TestCase::ad_hoc_test_result(local_10);
    TestPropertiesAsXmlAttributes_abi_cxx11_(result);
    std::operator<<((ostream *)psVar5,local_240);
    std::__cxx11::string::~string(local_240);
  }
  std::operator<<((ostream *)local_8,">\n");
  for (local_244 = 0; iVar2 = TestCase::total_test_count((TestCase *)0x16fd5c), local_244 < iVar2;
      local_244 = local_244 + 1) {
    this = TestCase::GetTestInfo
                     ((TestCase *)in_stack_fffffffffffffcd0,
                      (int)((ulong)in_stack_fffffffffffffcc8 >> 0x20));
    bVar1 = TestInfo::is_reportable(this);
    if (bVar1) {
      TestCase::name((TestCase *)0x16fdb9);
      in_stack_fffffffffffffcd0 =
           TestCase::GetTestInfo
                     ((TestCase *)in_stack_fffffffffffffcd0,
                      (int)((ulong)in_stack_fffffffffffffcc8 >> 0x20));
      OutputXmlTestInfo(in_stack_00000210,in_stack_00000208,in_stack_00000200);
    }
  }
  poVar4 = std::operator<<((ostream *)local_8,"  </");
  poVar4 = std::operator<<(poVar4,local_30);
  std::operator<<(poVar4,">\n");
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void XmlUnitTestResultPrinter::PrintXmlTestCase(std::ostream* stream,
                                                const TestCase& test_case) {
  const std::string kTestsuite = "testsuite";
  *stream << "  <" << kTestsuite;
  OutputXmlAttribute(stream, kTestsuite, "name", test_case.name());
  OutputXmlAttribute(stream, kTestsuite, "tests",
                     StreamableToString(test_case.reportable_test_count()));
  if (!GTEST_FLAG(list_tests)) {
    OutputXmlAttribute(stream, kTestsuite, "failures",
                       StreamableToString(test_case.failed_test_count()));
    OutputXmlAttribute(
        stream, kTestsuite, "disabled",
        StreamableToString(test_case.reportable_disabled_test_count()));
    OutputXmlAttribute(stream, kTestsuite, "errors", "0");
    OutputXmlAttribute(stream, kTestsuite, "time",
                       FormatTimeInMillisAsSeconds(test_case.elapsed_time()));
    *stream << TestPropertiesAsXmlAttributes(test_case.ad_hoc_test_result());
  }
  *stream << ">\n";
  for (int i = 0; i < test_case.total_test_count(); ++i) {
    if (test_case.GetTestInfo(i)->is_reportable())
      OutputXmlTestInfo(stream, test_case.name(), *test_case.GetTestInfo(i));
  }
  *stream << "  </" << kTestsuite << ">\n";
}